

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8d_parser.c
# Opt level: O2

void vp8hwdDecodeCoeffUpdate(VP8DParserContext_t *p)

{
  RK_U32 RVar1;
  long lVar2;
  long lVar3;
  RK_U8 (*paaaRVar4) [8] [3] [11];
  RK_U8 (*paaaRVar5) [8] [3] [11];
  long lVar6;
  long lVar7;
  RK_U8 (*paRVar8) [11];
  RK_U8 (*paRVar9) [11];
  RK_U8 (*local_60) [11];
  RK_U8 (*local_58) [8] [3] [11];
  
  if (((byte)vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_IN",800,
               "vp8hwdDecodeCoeffUpdate");
  }
  local_58 = (p->entropy).probCoeffs;
  local_60 = (RK_U8 (*) [11])CoeffUpdateProbs;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    paaaRVar4 = local_58;
    paRVar8 = local_60;
    for (lVar3 = 0; lVar3 != 8; lVar3 = lVar3 + 1) {
      paaaRVar5 = paaaRVar4;
      paRVar9 = paRVar8;
      for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
        for (lVar7 = 0; lVar7 != 0xb; lVar7 = lVar7 + 1) {
          RVar1 = vp8hwdDecodeBool(&p->bitstr,(uint)(*(RK_U8 (*) [3] [11])*paRVar9)[0][lVar7]);
          if (RVar1 != 0) {
            RVar1 = vp8hwdReadBits(&p->bitstr,8);
            (*paaaRVar5)[0][0][lVar7] = (RK_U8)RVar1;
          }
        }
        paRVar9 = paRVar9 + 1;
        paaaRVar5 = (RK_U8 (*) [8] [3] [11])((*paaaRVar5)[0] + 1);
      }
      paRVar8 = paRVar8 + 3;
      paaaRVar4 = (RK_U8 (*) [8] [3] [11])(*paaaRVar4 + 1);
    }
    local_60 = local_60 + 0x18;
    local_58 = local_58 + 1;
  }
  if (((byte)vp8d_debug & 1) != 0) {
    _mpp_log_l(4,"vp8d_parser","%s: line(%d), func(%s)",(char *)0x0,"FUN_OUT",0x32d,
               "vp8hwdDecodeCoeffUpdate");
  }
  return;
}

Assistant:

static void vp8hwdDecodeCoeffUpdate(VP8DParserContext_t *p)
{
    RK_U32 i, j, k, l;

    FUN_T("FUN_IN");
    for ( i = 0; i < 4; i++ ) {
        for ( j = 0; j < 8; j++ ) {
            for ( k = 0; k < 3; k++ ) {
                for ( l = 0; l < 11; l++ ) {
                    if (vp8hwdDecodeBool(&p->bitstr,
                                         CoeffUpdateProbs[i][j][k][l]))
                        p->entropy.probCoeffs[i][j][k][l] =
                            vp8hwdReadBits(&p->bitstr, 8);
                }
            }
        }
    }
    FUN_T("FUN_OUT");
}